

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

fourcc_t NodeEnumClassFilterRated
                   (anynode *AnyContext,array *ListId,fourcc_t ClassId,nodeenumclassfilterrated Func
                   ,void *Param)

{
  nodeclass **ppnVar1;
  long lVar2;
  nodeclass *pnVar3;
  short sVar4;
  short sVar5;
  int iVar6;
  nodeclass *pnVar7;
  bool_t bVar8;
  long lVar9;
  char *pcVar10;
  long *plVar11;
  ulong uVar12;
  nodeclassrated Item;
  fourcc_t local_64;
  int local_5c;
  array local_58;
  long local_40;
  int local_38;
  
  if (AnyContext == (anynode *)0x0) {
    __assert_fail("AnyContext != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x678,
                  "fourcc_t NodeEnumClassFilterRated(anynode *, array *, fourcc_t, nodeenumclassfilterrated, void *)"
                 );
  }
  lVar2 = **(long **)((long)AnyContext + 8);
  local_58._Begin = (char *)0x0;
  local_58._Used = 0;
  local_64 = 0;
  if (7 < *(ulong *)(lVar2 + 0x78)) {
    plVar11 = *(long **)(lVar2 + 0x70);
    local_5c = 0;
    sVar4 = 0;
    local_64 = 0;
    do {
      pnVar3 = (nodeclass *)*plVar11;
      if ((-1 < pnVar3->State) && (pnVar7 = pnVar3, (pnVar3->Flags & 8) == 0)) {
        do {
          if (*(fourcc_t *)&pnVar7[1].Meta == ClassId) {
            if (Func == (nodeenumclassfilterrated)0x0) {
              iVar6 = 1;
            }
            else {
              iVar6 = (*Func)(Param,pnVar3);
              if (iVar6 < 1) break;
            }
            if (ListId != (array *)0x0) {
              local_40 = *plVar11;
              local_38 = iVar6;
              ArrayAppend(&local_58,&local_40,0x10,0x40);
              break;
            }
            if (local_5c < iVar6) {
              lVar9 = *plVar11;
              sVar5 = *(short *)(lVar9 + 0x3e);
            }
            else {
              if (local_5c != iVar6) break;
              lVar9 = *plVar11;
              sVar5 = *(short *)(lVar9 + 0x3e);
              if (*(short *)(lVar9 + 0x3e) <= sVar4) break;
            }
            sVar4 = sVar5;
            local_64 = *(fourcc_t *)(lVar9 + 0x50);
            local_5c = iVar6;
            break;
          }
          ppnVar1 = &pnVar7->ParentClass;
          pnVar7 = *ppnVar1;
        } while (*ppnVar1 != (nodeclass *)0x0);
      }
      plVar11 = plVar11 + 1;
    } while (plVar11 !=
             (long *)((*(ulong *)(lVar2 + 0x78) & 0xfffffffffffffff8) + *(long *)(lVar2 + 0x70)));
  }
  if (ListId != (array *)0x0) {
    uVar12 = local_58._Used >> 4;
    ArraySortEx(&local_58,uVar12,0x10,CmpRatedClassPri,(void *)0x0,0);
    ListId->_Begin = (char *)0x0;
    ListId->_Used = 0;
    bVar8 = ArrayAppend(ListId,(void *)0x0,uVar12 << 2,0x40);
    if ((bVar8 != 0) && (0xf < local_58._Used)) {
      pcVar10 = ListId->_Begin;
      uVar12 = 0;
      do {
        *(undefined4 *)pcVar10 = *(undefined4 *)(*(long *)(local_58._Begin + uVar12) + 0x50);
        pcVar10 = pcVar10 + 4;
        uVar12 = uVar12 + 0x10;
      } while ((local_58._Used & 0xfffffffffffffff0) != uVar12);
    }
    ArrayClear(&local_58);
  }
  return local_64;
}

Assistant:

fourcc_t NodeEnumClassFilterRated(anynode* AnyContext, array* ListId, fourcc_t ClassId, nodeenumclassfilterrated Func, void* Param)
{
    nodecontext* p;
    const nodeclass* v;
    const nodeclass **i;
    array List;

    fourcc_t BestId = 0;
    int BestPri = 0;
    int BestRate = 0;

    assert(AnyContext != NULL);
    p = Node_Context(AnyContext);

    ArrayInit(&List);

    for (i=ARRAYBEGIN(p->NodeClass,const nodeclass*);i!=ARRAYEND(p->NodeClass,const nodeclass*);++i)
    {
        if ((*i)->State>=CLASS_REGISTERED && !((*i)->Flags & CFLAG_ABSTRACT)) // skip abstract
        {
            for (v=*i;v;v=v->ParentClass)
                if (NodeClass_ClassId(v) == ClassId)
                {
                    int Rating = Func ? Func(Param,*i):1;
                    if (Rating > 0)
                    {
                        if (!ListId)
                        {
                            if (BestRate < Rating || (BestRate == Rating && BestPri < (*i)->Priority))
                            {
                                BestId = NodeClass_ClassId(*i);
                                BestPri = (*i)->Priority;
                                BestRate = Rating;
                            }
                        }
                        else
                        {
                            nodeclassrated Item;
                            Item.Class = *i;
                            Item.Rating = Rating;
                            ArrayAppend(&List,&Item,sizeof(Item),64);
                        }
                    }
                    break;
                }
        }
    }

    if (ListId)
    {
        fourcc_t* a;
        nodeclassrated* b;
        size_t Count = ARRAYCOUNT(List,nodeclassrated);
        ArraySort(&List,nodeclassrated,CmpRatedClassPri, NULL, 0);

        ArrayInit(ListId);
        if (ArrayAppend(ListId,NULL,Count*sizeof(fourcc_t),64))
        {
            for (a=ARRAYBEGIN(*ListId,fourcc_t),b=ARRAYBEGIN(List,nodeclassrated);b!=ARRAYEND(List,nodeclassrated);++b,++a)
                *a = NodeClass_ClassId(b->Class);
        }
        ArrayClear(&List);
    }

    return BestId;
}